

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeHeap.cpp
# Opt level: O1

void __thiscall wasm::SafeHeap::addLoadFunc(SafeHeap *this,Load style,Module *module)

{
  Module *pMVar1;
  Type addressType;
  Name name;
  Function *pFVar2;
  Block *this_00;
  Expression *pEVar3;
  Expression *pEVar4;
  Binary *this_01;
  LocalSet *item;
  undefined1 *puVar5;
  BinaryOp BVar6;
  ExpressionList *this_02;
  initializer_list<wasm::Type> types;
  Signature sig;
  initializer_list<wasm::Type> __l;
  optional<wasm::Type> type_;
  Name name_00;
  Name name_01;
  Type local_98;
  Type local_90;
  HeapType local_88;
  MixedArena *local_80;
  SafeHeap *local_78;
  Module *local_70;
  Memory *local_68;
  Module *local_60;
  Type local_58;
  Builder builder;
  pointer local_48;
  _Head_base<0UL,_wasm::Function_*,_false> local_40;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> func;
  
  name_00 = getLoadName(&style);
  pFVar2 = Module::getFunctionOrNull(module,name_00);
  if (pFVar2 == (Function *)0x0) {
    name.super_IString.str._M_str = style.memory.super_IString.str._M_str;
    name.super_IString.str._M_len = style.memory.super_IString.str._M_len;
    local_78 = this;
    local_68 = Module::getMemory(module,name);
    pMVar1 = (Module *)(local_68->addressType).id;
    types._M_len = 2;
    types._M_array = &stack0xffffffffffffffa8;
    local_58.id = (uintptr_t)pMVar1;
    builder.wasm = pMVar1;
    wasm::Type::Type(&local_90,types);
    sig.results.id =
         style.super_SpecificExpression<(wasm::Expression::Id)12>.super_Expression.type.id;
    sig.params.id = local_90.id;
    HeapType::HeapType(&local_88,sig);
    __l._M_len = 1;
    __l._M_array = &local_98;
    local_98.id = (uintptr_t)pMVar1;
    local_70 = pMVar1;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&stack0xffffffffffffffa8,__l,
               (allocator_type *)
               ((long)&func._M_t.
                       super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                       .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 7));
    name_01.super_IString.str._M_str = name_00.super_IString.str._M_len;
    name_01.super_IString.str._M_len = (size_t)&local_40;
    Builder::makeFunction
              (name_01,(HeapType)name_00.super_IString.str._M_str,
               (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_88.id,
               (Expression *)&stack0xffffffffffffffa8);
    if ((Module *)local_58.id != (Module *)0x0) {
      operator_delete((void *)local_58.id,(long)local_48 - local_58.id);
    }
    local_80 = &module->allocator;
    local_60 = module;
    local_58.id = (uintptr_t)module;
    this_00 = (Block *)MixedArena::allocSpace(local_80,0x40,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = BlockId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
    (this_00->name).super_IString.str._M_len = 0;
    (this_00->name).super_IString.str._M_str = (char *)0x0;
    (this_00->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
         = (Expression **)0x0;
    (this_00->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    usedElements = 0;
    (this_00->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    allocatedElements = 0;
    (this_00->list).allocator = local_80;
    BVar6 = AddInt64;
    if ((local_68->addressType).id != 3) {
      BVar6 = AddInt32;
    }
    pEVar3 = (Expression *)MixedArena::allocSpace((MixedArena *)(local_58.id + 0x200),0x18,8);
    pEVar3->_id = LocalGetId;
    *(undefined4 *)(pEVar3 + 1) = 0;
    (pEVar3->type).id = (uintptr_t)local_70;
    pEVar4 = (Expression *)MixedArena::allocSpace((MixedArena *)(local_58.id + 0x200),0x18,8);
    pEVar4->_id = LocalGetId;
    *(undefined4 *)(pEVar4 + 1) = 1;
    (pEVar4->type).id = (uintptr_t)local_70;
    this_01 = (Binary *)MixedArena::allocSpace((MixedArena *)(local_58.id + 0x200),0x28,8);
    (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    this_01->op = BVar6;
    this_01->left = pEVar3;
    this_01->right = pEVar4;
    Binary::finalize(this_01);
    item = Builder::makeLocalSet((Builder *)&stack0xffffffffffffffa8,2,(Expression *)this_01);
    this_02 = &this_00->list;
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&this_02->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)item);
    addressType.id = (local_68->addressType).id;
    pEVar3 = makeBoundsCheck(local_78,style.super_SpecificExpression<(wasm::Expression::Id)12>.
                                      super_Expression.type,(Builder *)&stack0xffffffffffffffa8,0,2,
                             (uint)style.bytes,local_60,addressType,addressType.id == 3,
                             (Name)(local_68->super_Importable).super_Named.name.super_IString.str);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&this_02->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               pEVar3);
    if (1 < style.align.addr) {
      pEVar3 = makeAlignCheck(local_78,style.align,(Builder *)&stack0xffffffffffffffa8,2,local_60,
                              (Name)(local_68->super_Importable).super_Named.name.super_IString.str)
      ;
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&this_02->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,pEVar3)
      ;
    }
    pEVar4 = (Expression *)MixedArena::allocSpace(local_80,0x48,8);
    pEVar4->_id = LoadId;
    (pEVar4->type).id = 0;
    pEVar4[1].field_0x1 = 0;
    pEVar4[3].type.id = 0;
    *(undefined8 *)(pEVar4 + 4) = 0;
    pEVar4[1].type.id = 0;
    *(undefined8 *)(pEVar4 + 2) = 0;
    pEVar4->_id = style.super_SpecificExpression<(wasm::Expression::Id)12>.super_Expression._id;
    *(undefined7 *)&pEVar4->field_0x1 =
         style.super_SpecificExpression<(wasm::Expression::Id)12>.super_Expression._1_7_;
    (pEVar4->type).id =
         style.super_SpecificExpression<(wasm::Expression::Id)12>.super_Expression.type.id;
    *(ushort *)(pEVar4 + 1) = CONCAT11(style.signed_,style.bytes);
    pEVar4[1].type.id = style.offset.addr;
    *(address64_t *)(pEVar4 + 2) = style.align.addr;
    pEVar4[2].type.id = style._40_8_;
    *(Expression **)(pEVar4 + 3) = style.ptr;
    pEVar4[3].type.id = style.memory.super_IString.str._M_len;
    *(char **)(pEVar4 + 4) = style.memory.super_IString.str._M_str;
    puVar5 = (undefined1 *)MixedArena::allocSpace((MixedArena *)(local_58.id + 0x200),0x18,8);
    pMVar1 = local_60;
    *puVar5 = 8;
    *(undefined4 *)(puVar5 + 0x10) = 2;
    *(Module **)(puVar5 + 8) = local_70;
    *(undefined1 **)(pEVar4 + 3) = puVar5;
    pEVar3 = pEVar4;
    if (((char)pEVar4[2].type.id == '\x01') && (pEVar4[1].field_0x1 == '\x01')) {
      pEVar3 = Bits::makeSignExt(pEVar4,(uint)pEVar4[1]._id,local_60);
      pEVar4[1].field_0x1 = 0;
    }
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&this_02->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               pEVar3);
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 1;
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload._M_value.id =
         (Type)(Type)style.super_SpecificExpression<(wasm::Expression::Id)12>.super_Expression.type.
                     id;
    Block::finalize(this_00,type_,Unknown);
    (local_40._M_head_impl)->body = (Expression *)this_00;
    Module::addFunction(pMVar1,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                               &local_40);
    if (local_40._M_head_impl != (Function *)0x0) {
      std::default_delete<wasm::Function>::operator()
                ((default_delete<wasm::Function> *)&local_40,local_40._M_head_impl);
    }
  }
  return;
}

Assistant:

void addLoadFunc(Load style, Module* module) {
    auto name = getLoadName(&style);
    if (module->getFunctionOrNull(name)) {
      return;
    }
    // pointer, offset
    auto memory = module->getMemory(style.memory);
    auto addressType = memory->addressType;
    auto funcSig = Signature({addressType, addressType}, style.type);
    auto func = Builder::makeFunction(name, funcSig, {addressType});
    Builder builder(*module);
    auto* block = builder.makeBlock();
    // stash the sum of the pointer (0) and the size (1) in a local (2)
    block->list.push_back(builder.makeLocalSet(
      2,
      builder.makeBinary(memory->is64() ? AddInt64 : AddInt32,
                         builder.makeLocalGet(0, addressType),
                         builder.makeLocalGet(1, addressType))));
    // check for reading past valid memory: if pointer + offset + bytes
    block->list.push_back(makeBoundsCheck(style.type,
                                          builder,
                                          0,
                                          2,
                                          style.bytes,
                                          module,
                                          memory->addressType,
                                          memory->is64(),
                                          memory->name));
    // check proper alignment
    if (style.align > 1) {
      block->list.push_back(
        makeAlignCheck(style.align, builder, 2, module, memory->name));
    }
    // do the load
    auto* load = module->allocator.alloc<Load>();
    *load = style; // basically the same as the template we are given!
    load->ptr = builder.makeLocalGet(2, addressType);
    Expression* last = load;
    if (load->isAtomic && load->signed_) {
      // atomic loads cannot be signed, manually sign it
      last = Bits::makeSignExt(load, load->bytes, *module);
      load->signed_ = false;
    }
    block->list.push_back(last);
    block->finalize(style.type);
    func->body = block;
    module->addFunction(std::move(func));
  }